

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

float __thiscall
duckdb::WindowQuantileState<float>::WindowScalar<float,true>
          (WindowQuantileState<float> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  vector<std::pair<unsigned_long,_float>,_true> *dest;
  pointer this_00;
  pointer pHVar1;
  idx_t index;
  reference pvVar2;
  InternalException *this_01;
  float fVar3;
  allocator local_55;
  float local_54;
  string local_50 [32];
  
  if ((QuantileSortTree *)
      (this->qst).
      super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
      .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
    this_00 = unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
              ::operator->(&this->qst);
    fVar3 = QuantileSortTree::WindowScalar<float,float,true>(this_00,data,frames,n,result,q);
    return fVar3;
  }
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
       *)0x0) {
    pHVar1 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>,_true>
             ::operator->(&this->s);
    index = Interpolator<true>::Index(q,pHVar1->_count);
    pHVar1 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>,_true>
             ::operator->(&this->s);
    dest = &this->skips;
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>::
    at(pHVar1,index,1,
       &dest->
        super_vector<std::pair<unsigned_long,_float>,_std::allocator<std::pair<unsigned_long,_float>_>_>
      );
    pvVar2 = vector<std::pair<unsigned_long,_float>,_true>::get<true>(dest,0);
    local_54 = pvVar2->second;
    vector<std::pair<unsigned_long,_float>,_true>::get<true>
              (dest,(ulong)(0x10 < (ulong)((long)(this->skips).
                                                 super_vector<std::pair<unsigned_long,_float>,_std::allocator<std::pair<unsigned_long,_float>_>_>
                                                 .
                                                 super__Vector_base<std::pair<unsigned_long,_float>,_std::allocator<std::pair<unsigned_long,_float>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->skips).
                                                super_vector<std::pair<unsigned_long,_float>,_std::allocator<std::pair<unsigned_long,_float>_>_>
                                                .
                                                super__Vector_base<std::pair<unsigned_long,_float>,_std::allocator<std::pair<unsigned_long,_float>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)));
    fVar3 = Cast::Operation<float,float>(local_54);
    return fVar3;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_50,"No accelerator for scalar QUANTILE",&local_55);
  duckdb::InternalException::InternalException(this_01,local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}